

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O3

VectorNd __thiscall HermiteSpline<5U,_2U>::interpolate(HermiteSpline<5U,_2U> *this,double s)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  VectorNd *p;
  bool bVar4;
  long *in_RSI;
  long lVar5;
  long lVar6;
  double s_;
  double dVar7;
  double dVar8;
  VectorNd VVar9;
  
  lVar2 = *in_RSI;
  dVar1 = *(double *)(lVar2 + 0x60);
  if ((dVar1 < s) && (in_RSI[1] != lVar2)) {
    do {
      s = s - dVar1;
    } while (dVar1 < s);
  }
  dVar7 = 1.0;
  if (s <= 1.0) {
    dVar7 = s;
  }
  lVar5 = 0;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    VVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         (pointer)0x0;
    lVar6 = 0;
    dVar8 = 1.0;
    do {
      VVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
           (pointer)((double)VVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                             m_storage.m_data.array[0] +
                    dVar8 * *(double *)(lVar5 * 0x30 + lVar2 + lVar6 * 8));
      lVar6 = lVar6 + 1;
      dVar8 = (dVar7 / dVar1) * dVar8;
    } while (lVar6 != 6);
    (&(this->children).
      super__Vector_base<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
      ._M_impl.super__Vector_impl_data._M_start)[lVar5] =
         VVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
         [0];
    lVar5 = 1;
    bVar3 = false;
  } while (bVar4);
  VVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] = 1.0
  ;
  return (VectorNd)
         VVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
}

Assistant:

typename HermiteSpline<Order, Dims>::VectorNd HermiteSpline<Order, Dims>::interpolate(double s)
{
    int m = 0;
    double s_ = s;

    while (s_ > children[m].length && m < children.size())
    {
        s_ -= children[m].length;
    }

    if (s_ >= 1.0)
    {
        s_ = 1.0;
    }

    return children[m].interpolate(s_ / children[m].length);
}